

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_SampleBuffers.h
# Opt level: O0

void choc::buffer::
     copy<choc::buffer::BufferView<float,choc::buffer::InterleavedLayout>,choc::buffer::BufferView<float,choc::buffer::SeparateChannelLayout>>
               (BufferView<float,_choc::buffer::InterleavedLayout> *dest,
               BufferView<float,_choc::buffer::SeparateChannelLayout> *source)

{
  bool condition;
  Size other;
  float *pfVar1;
  float fVar2;
  SampleIterator<float> SVar3;
  uint local_74;
  FrameCount i;
  undefined1 local_60 [8];
  SampleIterator<float> dst;
  undefined1 local_40 [8];
  SampleIterator<float> src;
  ChannelCount chan;
  Size local_20;
  Size size;
  BufferView<float,_choc::buffer::SeparateChannelLayout> *source_local;
  BufferView<float,_choc::buffer::InterleavedLayout> *dest_local;
  
  size = (Size)source;
  local_20 = BufferView<float,_choc::buffer::SeparateChannelLayout>::getSize(source);
  other = BufferView<float,_choc::buffer::InterleavedLayout>::getSize(dest);
  condition = Size::operator==(&local_20,other);
  soul::checkAssertion(condition,"size == dest.getSize()","copy",0x2e1);
  for (src._12_4_ = 0; (uint)src._12_4_ < local_20.numChannels; src._12_4_ = src._12_4_ + 1) {
    SVar3 = BufferView<float,_choc::buffer::SeparateChannelLayout>::getIterator
                      ((BufferView<float,_choc::buffer::SeparateChannelLayout> *)size,src._12_4_);
    dst._8_8_ = SVar3.sample;
    src.sample._0_4_ = SVar3.stride;
    local_40 = (undefined1  [8])dst._8_8_;
    SVar3 = BufferView<float,_choc::buffer::InterleavedLayout>::getIterator(dest,src._12_4_);
    local_60 = (undefined1  [8])SVar3.sample;
    dst.sample._0_4_ = SVar3.stride;
    for (local_74 = 0; local_74 < local_20.numFrames; local_74 = local_74 + 1) {
      fVar2 = SampleIterator<float>::get((SampleIterator<float> *)local_40);
      pfVar1 = SampleIterator<float>::operator*((SampleIterator<float> *)local_60);
      *pfVar1 = fVar2;
      SampleIterator<float>::operator++((SampleIterator<float> *)local_60);
      SampleIterator<float>::operator++((SampleIterator<float> *)local_40);
    }
  }
  return;
}

Assistant:

static void copy (DestBuffer&& dest, const SourceBuffer& source)
{
    auto size = source.getSize();
    CHOC_ASSERT (size == dest.getSize());

    for (decltype (size.numChannels) chan = 0; chan < size.numChannels; ++chan)
    {
        auto src = source.getIterator (chan);
        auto dst = dest.getIterator (chan);

        for (decltype (size.numFrames) i = 0; i < size.numFrames; ++i)
        {
            *dst = static_cast<decltype (dst.get())> (src.get());
            ++dst;
            ++src;
        }
    }
}